

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

void cvRescale(CVodeMem cv_mem)

{
  long in_RDI;
  int j;
  undefined4 local_c;
  
  *(undefined8 *)(in_RDI + 0x658) = *(undefined8 *)(in_RDI + 0x158);
  for (local_c = 1; local_c <= *(int *)(in_RDI + 0x120); local_c = local_c + 1) {
    *(double *)(in_RDI + 0x658 + (long)local_c * 8) =
         *(double *)(in_RDI + 0x158) * *(double *)(in_RDI + 0x658 + (long)(local_c + -1) * 8);
  }
  N_VScaleVectorArray(*(undefined4 *)(in_RDI + 0x120),in_RDI + 0x658,in_RDI + 0x68,in_RDI + 0x68);
  *(double *)(in_RDI + 0x140) = *(double *)(in_RDI + 0x160) * *(double *)(in_RDI + 0x158);
  *(undefined8 *)(in_RDI + 0x150) = *(undefined8 *)(in_RDI + 0x140);
  *(undefined8 *)(in_RDI + 0x160) = *(undefined8 *)(in_RDI + 0x140);
  *(undefined4 *)(in_RDI + 0x550) = 0;
  return;
}

Assistant:

void cvRescale(CVodeMem cv_mem)
{
  int j;

  /* compute scaling factors */
  cv_mem->cv_cvals[0] = cv_mem->cv_eta;
  for (j = 1; j <= cv_mem->cv_q; j++)
  {
    cv_mem->cv_cvals[j] = cv_mem->cv_eta * cv_mem->cv_cvals[j - 1];
  }

  (void)N_VScaleVectorArray(cv_mem->cv_q, cv_mem->cv_cvals, cv_mem->cv_zn + 1,
                            cv_mem->cv_zn + 1);

  cv_mem->cv_h      = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_next_h = cv_mem->cv_h;
  cv_mem->cv_hscale = cv_mem->cv_h;
  cv_mem->cv_nscon  = 0;
}